

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O0

apx_error_t
apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t *self,char *file_name)

{
  apx_size_t aVar1;
  uint32_t address;
  apx_fileManager_t *self_00;
  apx_file_t *self_01;
  apx_size_t result;
  apx_size_t cmd_size;
  apx_file_t *file;
  apx_fileManager_t *file_manager;
  uint8_t auStack_28 [4];
  uint8_t buffer [12];
  char *file_name_local;
  apx_clientTestConnection_t *self_local;
  
  if ((self == (apx_clientTestConnection_t *)0x0) || (file_name == (char *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    buffer._4_8_ = file_name;
    self_00 = apx_clientConnection_get_file_manager(&self->base);
    if (self_00 == (apx_fileManager_t *)0x0) {
      __assert_fail("file_manager != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/client_test_connection.c"
                    ,0x11d,
                    "apx_error_t apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t *, const char *)"
                   );
    }
    self_01 = apx_fileManager_find_local_file_by_name(self_00,(char *)buffer._4_8_);
    if (self_01 == (apx_file_t *)0x0) {
      self_local._4_4_ = 0x31;
    }
    else {
      aVar1 = rmf_address_encode((uint8_t *)((long)&file_manager + 4),4,0x3ffffc00,false);
      if (aVar1 == 4) {
        address = apx_file_get_address_without_flags(self_01);
        aVar1 = rmf_encode_open_file_cmd(auStack_28,8,address);
        if (aVar1 == 0) {
          self_local._4_4_ = 6;
        }
        else {
          self_local._4_4_ =
               apx_fileManager_message_received(self_00,(uint8_t *)((long)&file_manager + 4),0xc);
        }
      }
      else {
        self_local._4_4_ = 6;
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_clientTestConnection_request_open_local_file(apx_clientTestConnection_t* self, char const* file_name)
{
   if ( (self != NULL) && (file_name != NULL) )
   {
      uint8_t  buffer[RMF_HIGH_ADDR_SIZE + RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE];
      apx_fileManager_t* file_manager = apx_clientConnection_get_file_manager(&self->base);
      assert(file_manager != NULL);
      apx_file_t* file = apx_fileManager_find_local_file_by_name(file_manager, file_name);
      if (file == NULL)
      {
         return APX_FILE_NOT_FOUND_ERROR;
      }
      if (rmf_address_encode(buffer, RMF_HIGH_ADDR_SIZE, RMF_CMD_AREA_START_ADDRESS, false) != RMF_HIGH_ADDR_SIZE)
      {
         return APX_INTERNAL_ERROR;
      }
      apx_size_t const cmd_size = RMF_CMD_TYPE_SIZE + RMF_FILE_OPEN_CMD_SIZE;
      apx_size_t result = rmf_encode_open_file_cmd(buffer + RMF_HIGH_ADDR_SIZE, cmd_size, apx_file_get_address_without_flags(file));
      if (result == 0)
      {
         return APX_INTERNAL_ERROR;
      }
      return apx_fileManager_message_received(file_manager, buffer, sizeof(buffer));
   }
   return APX_INVALID_ARGUMENT_ERROR;
}